

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

int Cba_NtkNewStrId(Cba_Ntk_t *pNtk,char *format,...)

{
  Abc_Nam_t *p;
  char in_AL;
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Str_t *p_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_f8;
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  p = pNtk->pDesign->pStrs;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  p_00 = Abc_NamBuffer(p);
  local_f0 = &args[0].overflow_arg_area;
  local_f8 = 0x3000000010;
  local_e8 = local_d8;
  Vec_StrGrow(p_00,p_00->nSize + 1000);
  uVar1 = vsnprintf(p_00->pArray + p_00->nSize,1000,format,&local_f8);
  if (1000 < (int)uVar1) {
    Vec_StrGrow(p_00,uVar1 + p_00->nSize + 1000);
    uVar2 = vsnprintf(p_00->pArray + p_00->nSize,(ulong)uVar1,format,&local_f8);
    if (uVar2 != uVar1) {
      __assert_fail("nSize == nAdded",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                    ,0x1e0,"int Cba_NtkNewStrId(Cba_Ntk_t *, const char *, ...)");
    }
  }
  iVar3 = Abc_NamStrFindOrAddLim
                    (p,p_00->pArray + p_00->nSize,p_00->pArray + p_00->nSize + (int)uVar1,(int *)0x0
                    );
  return iVar3;
}

Assistant:

static inline int Cba_NtkNewStrId( Cba_Ntk_t * pNtk, const char * format, ...  )
{
    Abc_Nam_t * p = Cba_NtkNam( pNtk );
    Vec_Str_t * vBuf = Abc_NamBuffer( p );
    int nAdded, nSize = 1000; 
    va_list args;   va_start( args, format );
    Vec_StrGrow( vBuf, Vec_StrSize(vBuf) + nSize );
    nAdded = vsnprintf( Vec_StrLimit(vBuf), nSize, format, args );
    if ( nAdded > nSize )
    {
        Vec_StrGrow( vBuf, Vec_StrSize(vBuf) + nAdded + nSize );
        nSize = vsnprintf( Vec_StrLimit(vBuf), nAdded, format, args );
        assert( nSize == nAdded );
    }
    va_end( args );
    return Abc_NamStrFindOrAddLim( p, Vec_StrLimit(vBuf), Vec_StrLimit(vBuf) + nAdded, NULL );
}